

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.h
# Opt level: O0

void google::protobuf::Join<int_const*>(int *start,int *end,char *delim,string *result)

{
  int *result_00;
  AlphaNum local_60;
  int32 *local_30;
  int *it;
  string *result_local;
  char *delim_local;
  int *end_local;
  int *start_local;
  
  it = (int *)result;
  result_local = (string *)delim;
  delim_local = (char *)end;
  end_local = start;
  for (local_30 = start; local_30 != (int32 *)delim_local; local_30 = local_30 + 1) {
    if (local_30 != end_local) {
      std::__cxx11::string::append((char *)it);
    }
    result_00 = it;
    strings::AlphaNum::AlphaNum(&local_60,*local_30);
    StrAppend((string *)result_00,&local_60);
  }
  return;
}

Assistant:

void Join(Iterator start, Iterator end,
          const char* delim, string* result) {
  for (Iterator it = start; it != end; ++it) {
    if (it != start) {
      result->append(delim);
    }
    StrAppend(result, *it);
  }
}